

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visit.cpp
# Opt level: O3

value_type_conflict1
(anonymous_namespace)::serialize_and_visit<(anonymous_namespace)::StoreT<int>,int>(int *in)

{
  long lVar1;
  int iVar2;
  Result *result;
  string_view full_tag;
  string_view tag_00;
  cx_string<1UL> tag;
  StoreT<int> visitor;
  InputStream istream;
  stringstream stream;
  ExpressionDecomposer local_1e0;
  char local_1da [2];
  StoreT<int> local_1d8;
  Result local_1d0;
  stringstream *local_1b0;
  undefined1 local_1a8 [32];
  char local_188 [12];
  undefined4 auStack_17c [25];
  ios_base local_118 [264];
  
  std::__cxx11::stringstream::stringstream((stringstream *)(local_1a8 + 0x10));
  lVar1 = *(long *)(local_1a8._16_8_ + -0x18);
  *(undefined4 *)((long)auStack_17c + lVar1) = 4;
  std::ios::clear((int)&stack0xfffffffffffffe18 + (int)lVar1 + 0x50);
  local_1d0._0_4_ = *in;
  std::ostream::write(local_188,(long)&local_1d0);
  local_1d8._value = 0;
  local_1d8._has_visit = false;
  result = (Result *)&local_1b0;
  local_1da[0] = 'i';
  local_1da[1] = '\0';
  full_tag._len = 1;
  full_tag._ptr = local_1da;
  tag_00._len = 1;
  tag_00._ptr = local_1da;
  local_1b0 = (stringstream *)(local_1a8 + 0x10);
  mserialize::detail::visit_impl<(anonymous_namespace)::StoreT<int>,InputStream>
            (full_tag,tag_00,&local_1d8,(InputStream *)result,0x800);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_1e0,DT_CHECK);
  local_1a8._0_8_ = &local_1d8._has_visit;
  local_1a8._8_4_ = local_1e0.m_at;
  doctest::detail::Expression_lhs::operator_cast_to_Result(&local_1d0,(Expression_lhs *)local_1a8);
  doctest::detail::decomp_assert
            ((detail *)0xa,0x1b7338,(char *)0x2f,0x1b8b16,&local_1d0.m_passed,result);
  doctest::String::~String(&local_1d0.m_decomp);
  iVar2 = local_1d8._value;
  std::__cxx11::stringstream::~stringstream((stringstream *)(local_1a8 + 0x10));
  std::ios_base::~ios_base(local_118);
  return iVar2;
}

Assistant:

typename Visitor::value_type
serialize_and_visit(const T& in)
{
  std::stringstream stream;
  stream.exceptions(std::ios_base::failbit);

  // serialize
  OutputStream ostream{stream};
  mserialize::serialize(in, ostream);

  // visit
  Visitor visitor;
  InputStream istream{stream};
  const auto tag = mserialize::tag<T>();
  mserialize::visit(tag, visitor, istream);

  return visitor.value();
}